

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::Impl::copy_sub_create_info<VkPipelineInputAssemblyStateCreateInfo>
          (Impl *this,VkPipelineInputAssemblyStateCreateInfo **sub_info,ScratchAllocator *alloc,
          DynamicStateInfo *dynamic_state_info,VkGraphicsPipelineLibraryFlagsEXT state_flags)

{
  VkPipelineInputAssemblyStateCreateInfo *pVVar1;
  void *pvVar2;
  VkPrimitiveTopology VVar3;
  VkBool32 VVar4;
  undefined4 uVar5;
  VkStructureType VVar6;
  undefined4 uVar7;
  bool bVar8;
  VkPipelineInputAssemblyStateCreateInfo *pVVar9;
  bool bVar10;
  void *pNext;
  void *local_38;
  
  pVVar1 = *sub_info;
  bVar10 = true;
  if (pVVar1 != (VkPipelineInputAssemblyStateCreateInfo *)0x0) {
    pVVar9 = (VkPipelineInputAssemblyStateCreateInfo *)
             ScratchAllocator::allocate_raw(alloc,0x20,0x10);
    if (pVVar9 != (VkPipelineInputAssemblyStateCreateInfo *)0x0) {
      VVar6 = pVVar1->sType;
      uVar7 = *(undefined4 *)&pVVar1->field_0x4;
      pvVar2 = pVVar1->pNext;
      VVar3 = pVVar1->topology;
      VVar4 = pVVar1->primitiveRestartEnable;
      uVar5 = *(undefined4 *)&pVVar1->field_0x1c;
      pVVar9->flags = pVVar1->flags;
      pVVar9->topology = VVar3;
      pVVar9->primitiveRestartEnable = VVar4;
      *(undefined4 *)&pVVar9->field_0x1c = uVar5;
      pVVar9->sType = VVar6;
      *(undefined4 *)&pVVar9->field_0x4 = uVar7;
      pVVar9->pNext = pvVar2;
    }
    *sub_info = pVVar9;
    local_38 = (void *)0x0;
    bVar8 = copy_pnext_chain(this,pVVar9->pNext,alloc,&local_38,dynamic_state_info,state_flags);
    if (bVar8) {
      (*sub_info)->pNext = local_38;
    }
    else {
      bVar10 = false;
    }
  }
  return bVar10;
}

Assistant:

bool StateRecorder::Impl::copy_sub_create_info(const SubCreateInfo *&sub_info, ScratchAllocator &alloc,
                                               const DynamicStateInfo *dynamic_state_info,
                                               VkGraphicsPipelineLibraryFlagsEXT state_flags)
{
	if (sub_info)
	{
		sub_info = copy(sub_info, 1, alloc);
		const void *pNext = nullptr;
		if (!copy_pnext_chain(sub_info->pNext, alloc, &pNext, dynamic_state_info, state_flags))
			return false;
		const_cast<SubCreateInfo *>(sub_info)->pNext = pNext;
	}

	return true;
}